

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::GRULayerParams::_internal_mutable_updategatebiasvector(GRULayerParams *this)

{
  Arena *arena;
  WeightParams *pWVar1;
  WeightParams *p;
  GRULayerParams *this_local;
  
  if (this->updategatebiasvector_ == (WeightParams *)0x0) {
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pWVar1 = google::protobuf::MessageLite::CreateMaybeMessage<CoreML::Specification::WeightParams>
                       (arena);
    this->updategatebiasvector_ = pWVar1;
  }
  return this->updategatebiasvector_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* GRULayerParams::_internal_mutable_updategatebiasvector() {
  
  if (updategatebiasvector_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::WeightParams>(GetArenaForAllocation());
    updategatebiasvector_ = p;
  }
  return updategatebiasvector_;
}